

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_avx2::forward_inplace(Swish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  void *pvVar8;
  int iVar9;
  undefined1 (*pauVar10) [32];
  int _c;
  int iVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  Mat local_c0;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  iVar11 = bottom_top_blob->c;
  iVar13 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  iVar9 = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar13 < 1) {
      iVar13 = _c;
    }
    if (iVar11 < 1) {
      iVar11 = iVar9;
    }
    auVar17._8_4_ = 0x3f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar17._12_4_ = 0x3f800000;
    auVar17._16_4_ = 0x3f800000;
    auVar17._20_4_ = 0x3f800000;
    auVar17._24_4_ = 0x3f800000;
    auVar17._28_4_ = 0x3f800000;
    for (; _c != iVar11; _c = _c + 1) {
      Mat::channel(&local_c0,bottom_top_blob,_c);
      pauVar10 = (undefined1 (*) [32])local_c0.data;
      Mat::~Mat(&local_c0);
      auVar81._8_4_ = 0x3d2aa9c1;
      auVar81._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar81._12_4_ = 0x3d2aa9c1;
      auVar81._16_4_ = 0x3d2aa9c1;
      auVar81._20_4_ = 0x3d2aa9c1;
      auVar81._24_4_ = 0x3d2aa9c1;
      auVar81._28_4_ = 0x3d2aa9c1;
      auVar79._8_4_ = 0x3c088908;
      auVar79._0_8_ = 0x3c0889083c088908;
      auVar79._12_4_ = 0x3c088908;
      auVar79._16_4_ = 0x3c088908;
      auVar79._20_4_ = 0x3c088908;
      auVar79._24_4_ = 0x3c088908;
      auVar79._28_4_ = 0x3c088908;
      auVar77._8_4_ = 0x3ab743ce;
      auVar77._0_8_ = 0x3ab743ce3ab743ce;
      auVar77._12_4_ = 0x3ab743ce;
      auVar77._16_4_ = 0x3ab743ce;
      auVar77._20_4_ = 0x3ab743ce;
      auVar77._24_4_ = 0x3ab743ce;
      auVar77._28_4_ = 0x3ab743ce;
      auVar73._8_4_ = 0xbf317218;
      auVar73._0_8_ = 0xbf317218bf317218;
      auVar73._12_4_ = 0xbf317218;
      auVar73._16_4_ = 0xbf317218;
      auVar73._20_4_ = 0xbf317218;
      auVar73._24_4_ = 0xbf317218;
      auVar73._28_4_ = 0xbf317218;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar71._16_4_ = 0x3f800000;
      auVar71._20_4_ = 0x3f800000;
      auVar71._24_4_ = 0x3f800000;
      auVar71._28_4_ = 0x3f800000;
      auVar69._8_4_ = 0x3f000000;
      auVar69._0_8_ = 0x3f0000003f000000;
      auVar69._12_4_ = 0x3f000000;
      auVar69._16_4_ = 0x3f000000;
      auVar69._20_4_ = 0x3f000000;
      auVar69._24_4_ = 0x3f000000;
      auVar69._28_4_ = 0x3f000000;
      auVar67._8_4_ = 0x3fb8aa3b;
      auVar67._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar67._12_4_ = 0x3fb8aa3b;
      auVar67._16_4_ = 0x3fb8aa3b;
      auVar67._20_4_ = 0x3fb8aa3b;
      auVar67._24_4_ = 0x3fb8aa3b;
      auVar67._28_4_ = 0x3fb8aa3b;
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar24._16_4_ = 0xc2b0c0a5;
      auVar24._20_4_ = 0xc2b0c0a5;
      auVar24._24_4_ = 0xc2b0c0a5;
      auVar24._28_4_ = 0xc2b0c0a5;
      auVar38._8_4_ = 0x42b0c0a5;
      auVar38._0_8_ = 0x42b0c0a542b0c0a5;
      auVar38._12_4_ = 0x42b0c0a5;
      auVar38._16_4_ = 0x42b0c0a5;
      auVar38._20_4_ = 0x42b0c0a5;
      auVar38._24_4_ = 0x42b0c0a5;
      auVar38._28_4_ = 0x42b0c0a5;
      iVar9 = iVar13;
      while (bVar14 = iVar9 != 0, iVar9 = iVar9 + -1, bVar14) {
        auVar1 = *pauVar10;
        auVar33._0_8_ = auVar1._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = -auVar1._8_4_;
        auVar33._12_4_ = -auVar1._12_4_;
        auVar33._16_4_ = -auVar1._16_4_;
        auVar33._20_4_ = -auVar1._20_4_;
        auVar33._24_4_ = -auVar1._24_4_;
        auVar33._28_4_ = auVar1._28_4_ ^ 0x80000000;
        auVar33 = vminps_avx(auVar33,auVar38);
        auVar2 = vmaxps_avx(auVar33,auVar24);
        auVar16 = vfmadd213ps_fma(auVar67,auVar2,auVar69);
        auVar6 = vroundps_avx(ZEXT1632(auVar16),1);
        auVar33 = vcmpps_avx(ZEXT1632(auVar16),auVar6,1);
        auVar33 = vandps_avx(auVar71,auVar33);
        auVar33 = vsubps_avx(auVar6,auVar33);
        auVar31 = vfmadd231ps_fma(auVar2,auVar33,auVar73);
        auVar21 = ZEXT1632(auVar31);
        fVar3 = auVar31._0_4_;
        fVar15 = auVar31._4_4_;
        fVar4 = auVar31._8_4_;
        fVar5 = auVar31._12_4_;
        auVar2._28_4_ = auVar6._28_4_;
        auVar2._0_28_ =
             ZEXT1628(CONCAT412(fVar5 * fVar5,
                                CONCAT48(fVar4 * fVar4,CONCAT44(fVar15 * fVar15,fVar3 * fVar3))));
        auVar50._8_4_ = 0x39506967;
        auVar50._0_8_ = 0x3950696739506967;
        auVar50._12_4_ = 0x39506967;
        auVar50._16_4_ = 0x39506967;
        auVar50._20_4_ = 0x39506967;
        auVar50._24_4_ = 0x39506967;
        auVar50._28_4_ = 0x39506967;
        auVar16 = vfmadd213ps_fma(auVar50,auVar21,auVar77);
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar21,auVar79);
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar21,auVar81);
        auVar75._8_4_ = 0x3e2aaaaa;
        auVar75._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar75._12_4_ = 0x3e2aaaaa;
        auVar75._16_4_ = 0x3e2aaaaa;
        auVar75._20_4_ = 0x3e2aaaaa;
        auVar75._24_4_ = 0x3e2aaaaa;
        auVar75._28_4_ = 0x3e2aaaaa;
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar31),auVar75);
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar31),auVar69);
        auVar22._0_4_ = fVar3 + 1.0;
        auVar22._4_4_ = fVar15 + 1.0;
        auVar22._8_4_ = fVar4 + 1.0;
        auVar22._12_4_ = fVar5 + 1.0;
        auVar22._16_4_ = 0x3f800000;
        auVar22._20_4_ = 0x3f800000;
        auVar22._24_4_ = 0x3f800000;
        auVar22._28_4_ = 0x3f800000;
        auVar16 = vfmadd231ps_fma(auVar22,auVar2,ZEXT1632(auVar16));
        auVar32._0_4_ = (int)auVar33._0_4_;
        auVar32._4_4_ = (int)auVar33._4_4_;
        auVar32._8_4_ = (int)auVar33._8_4_;
        auVar32._12_4_ = (int)auVar33._12_4_;
        auVar32._16_4_ = (int)auVar33._16_4_;
        auVar32._20_4_ = (int)auVar33._20_4_;
        auVar32._24_4_ = (int)auVar33._24_4_;
        auVar32._28_4_ = (int)auVar33._28_4_;
        auVar33 = vpslld_avx2(auVar32,0x17);
        auVar33 = vpaddd_avx2(auVar33,auVar17);
        auVar16 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar16),auVar71);
        auVar33 = vrcpps_avx(ZEXT1632(auVar16));
        auVar21._4_4_ = auVar1._4_4_ * auVar33._4_4_;
        auVar21._0_4_ = auVar1._0_4_ * auVar33._0_4_;
        auVar21._8_4_ = auVar1._8_4_ * auVar33._8_4_;
        auVar21._12_4_ = auVar1._12_4_ * auVar33._12_4_;
        auVar21._16_4_ = auVar1._16_4_ * auVar33._16_4_;
        auVar21._20_4_ = auVar1._20_4_ * auVar33._20_4_;
        auVar21._24_4_ = auVar1._24_4_ * auVar33._24_4_;
        auVar21._28_4_ = auVar6._28_4_;
        auVar16 = vfmsub213ps_fma(ZEXT1632(auVar16),auVar21,auVar1);
        auVar16 = vfnmadd213ps_fma(ZEXT1632(auVar16),auVar33,auVar21);
        *pauVar10 = ZEXT1632(auVar16);
        pauVar10 = pauVar10 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar13 < 1) {
      iVar13 = _c;
    }
    if (iVar11 < 1) {
      iVar11 = iVar9;
    }
    auVar16._8_4_ = 0x3f800000;
    auVar16._0_8_ = 0x3f8000003f800000;
    auVar16._12_4_ = 0x3f800000;
    for (; _c != iVar11; _c = _c + 1) {
      Mat::channel(&local_c0,bottom_top_blob,_c);
      pauVar10 = (undefined1 (*) [32])local_c0.data;
      Mat::~Mat(&local_c0);
      auVar80._8_4_ = 0x3d2aa9c1;
      auVar80._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar80._12_4_ = 0x3d2aa9c1;
      auVar78._8_4_ = 0x3c088908;
      auVar78._0_8_ = 0x3c0889083c088908;
      auVar78._12_4_ = 0x3c088908;
      auVar76._8_4_ = 0x3ab743ce;
      auVar76._0_8_ = 0x3ab743ce3ab743ce;
      auVar76._12_4_ = 0x3ab743ce;
      auVar72._8_4_ = 0xbf317218;
      auVar72._0_8_ = 0xbf317218bf317218;
      auVar72._12_4_ = 0xbf317218;
      auVar70._8_4_ = 0x3f800000;
      auVar70._0_8_ = 0x3f8000003f800000;
      auVar70._12_4_ = 0x3f800000;
      auVar68._8_4_ = 0x3f000000;
      auVar68._0_8_ = 0x3f0000003f000000;
      auVar68._12_4_ = 0x3f000000;
      auVar66._8_4_ = 0x3fb8aa3b;
      auVar66._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar66._12_4_ = 0x3fb8aa3b;
      auVar57._8_4_ = 0xc2b0c0a5;
      auVar57._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar57._12_4_ = 0xc2b0c0a5;
      auVar54._8_4_ = 0x42b0c0a5;
      auVar54._0_8_ = 0x42b0c0a542b0c0a5;
      auVar54._12_4_ = 0x42b0c0a5;
      iVar9 = iVar13;
      while (bVar14 = iVar9 != 0, iVar9 = iVar9 + -1, bVar14) {
        auVar31 = *(undefined1 (*) [16])*pauVar10;
        auVar18._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar18._8_4_ = -auVar31._8_4_;
        auVar18._12_4_ = -auVar31._12_4_;
        auVar27 = vminps_avx(auVar18,auVar54);
        auVar28 = vmaxps_avx(auVar27,auVar57);
        auVar27 = vfmadd213ps_fma(auVar66,auVar28,auVar68);
        auVar39._0_4_ = (int)auVar27._0_4_;
        auVar39._4_4_ = (int)auVar27._4_4_;
        auVar39._8_4_ = (int)auVar27._8_4_;
        auVar39._12_4_ = (int)auVar27._12_4_;
        auVar20 = vcvtdq2ps_avx(auVar39);
        auVar27 = vcmpps_avx(auVar27,auVar20,1);
        auVar27 = vandps_avx(auVar70,auVar27);
        auVar27 = vsubps_avx(auVar20,auVar27);
        auVar28 = vfmadd231ps_fma(auVar28,auVar27,auVar72);
        fVar3 = auVar28._0_4_;
        auVar40._0_4_ = fVar3 * fVar3;
        fVar15 = auVar28._4_4_;
        auVar40._4_4_ = fVar15 * fVar15;
        fVar4 = auVar28._8_4_;
        auVar40._8_4_ = fVar4 * fVar4;
        fVar5 = auVar28._12_4_;
        auVar40._12_4_ = fVar5 * fVar5;
        auVar48._8_4_ = 0x39506967;
        auVar48._0_8_ = 0x3950696739506967;
        auVar48._12_4_ = 0x39506967;
        auVar20 = vfmadd213ps_fma(auVar48,auVar28,auVar76);
        auVar20 = vfmadd213ps_fma(auVar20,auVar28,auVar78);
        auVar20 = vfmadd213ps_fma(auVar20,auVar28,auVar80);
        auVar74._8_4_ = 0x3e2aaaaa;
        auVar74._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar74._12_4_ = 0x3e2aaaaa;
        auVar20 = vfmadd213ps_fma(auVar20,auVar28,auVar74);
        auVar20 = vfmadd213ps_fma(auVar20,auVar28,auVar68);
        auVar19._0_4_ = fVar3 + 1.0;
        auVar19._4_4_ = fVar15 + 1.0;
        auVar19._8_4_ = fVar4 + 1.0;
        auVar19._12_4_ = fVar5 + 1.0;
        auVar20 = vfmadd231ps_fma(auVar19,auVar40,auVar20);
        auVar26._0_4_ = (int)auVar27._0_4_;
        auVar26._4_4_ = (int)auVar27._4_4_;
        auVar26._8_4_ = (int)auVar27._8_4_;
        auVar26._12_4_ = (int)auVar27._12_4_;
        auVar27 = vpslld_avx(auVar26,0x17);
        auVar27 = vpaddd_avx(auVar27,auVar16);
        auVar20 = vfmadd213ps_fma(auVar27,auVar20,auVar70);
        auVar27 = vrcpps_avx(auVar20);
        auVar41._0_4_ = auVar31._0_4_ * auVar27._0_4_;
        auVar41._4_4_ = auVar31._4_4_ * auVar27._4_4_;
        auVar41._8_4_ = auVar31._8_4_ * auVar27._8_4_;
        auVar41._12_4_ = auVar31._12_4_ * auVar27._12_4_;
        auVar31 = vfmsub213ps_fma(auVar20,auVar41,auVar31);
        auVar31 = vfnmadd213ps_fma(auVar31,auVar27,auVar41);
        *(undefined1 (*) [16])*pauVar10 = auVar31;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      }
    }
  }
  else {
    if (iVar11 < 1) {
      iVar11 = iVar9;
    }
    local_58 = 0x80000000;
    uStack_54 = 0x80000000;
    uStack_50 = 0x80000000;
    uStack_4c = 0x80000000;
    uStack_48 = 0x80000000;
    uStack_44 = 0x80000000;
    uStack_40 = 0x80000000;
    uStack_3c = 0x80000000;
    local_78 = 0x3f800000;
    uStack_74 = 0x3f800000;
    uStack_70 = 0x3f800000;
    uStack_6c = 0x3f800000;
    uStack_68 = 0x3f800000;
    uStack_64 = 0x3f800000;
    uStack_60 = 0x3f800000;
    uStack_5c = 0x3f800000;
    for (; _c != iVar11; _c = _c + 1) {
      Mat::channel(&local_c0,bottom_top_blob,_c);
      pvVar8 = local_c0.data;
      Mat::~Mat(&local_c0);
      lVar12 = 0;
      pauVar10 = (undefined1 (*) [32])pvVar8;
      for (iVar9 = 0; iVar9 + 7 < iVar13; iVar9 = iVar9 + 8) {
        auVar17 = *pauVar10;
        auVar23._0_4_ = (uint)auVar17._0_4_ ^ local_58;
        auVar23._4_4_ = (uint)auVar17._4_4_ ^ uStack_54;
        auVar23._8_4_ = (uint)auVar17._8_4_ ^ uStack_50;
        auVar23._12_4_ = (uint)auVar17._12_4_ ^ uStack_4c;
        auVar23._16_4_ = (uint)auVar17._16_4_ ^ uStack_48;
        auVar23._20_4_ = (uint)auVar17._20_4_ ^ uStack_44;
        auVar23._24_4_ = (uint)auVar17._24_4_ ^ uStack_40;
        auVar23._28_4_ = auVar17._28_4_ ^ uStack_3c;
        auVar34._8_4_ = 0x42b0c0a5;
        auVar34._0_8_ = 0x42b0c0a542b0c0a5;
        auVar34._12_4_ = 0x42b0c0a5;
        auVar34._16_4_ = 0x42b0c0a5;
        auVar34._20_4_ = 0x42b0c0a5;
        auVar34._24_4_ = 0x42b0c0a5;
        auVar34._28_4_ = 0x42b0c0a5;
        auVar38 = vminps_avx(auVar23,auVar34);
        auVar35._8_4_ = 0xc2b0c0a5;
        auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar35._12_4_ = 0xc2b0c0a5;
        auVar35._16_4_ = 0xc2b0c0a5;
        auVar35._20_4_ = 0xc2b0c0a5;
        auVar35._24_4_ = 0xc2b0c0a5;
        auVar35._28_4_ = 0xc2b0c0a5;
        auVar24 = vmaxps_avx(auVar38,auVar35);
        auVar36._8_4_ = 0x3fb8aa3b;
        auVar36._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar36._12_4_ = 0x3fb8aa3b;
        auVar36._16_4_ = 0x3fb8aa3b;
        auVar36._20_4_ = 0x3fb8aa3b;
        auVar36._24_4_ = 0x3fb8aa3b;
        auVar36._28_4_ = 0x3fb8aa3b;
        auVar53._8_4_ = 0x3f000000;
        auVar53._0_8_ = 0x3f0000003f000000;
        auVar53._12_4_ = 0x3f000000;
        auVar53._16_4_ = 0x3f000000;
        auVar53._20_4_ = 0x3f000000;
        auVar53._24_4_ = 0x3f000000;
        auVar53._28_4_ = 0x3f000000;
        auVar16 = vfmadd213ps_fma(auVar36,auVar24,auVar53);
        auVar67 = vroundps_avx(ZEXT1632(auVar16),1);
        auVar38 = vcmpps_avx(ZEXT1632(auVar16),auVar67,1);
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar56._16_4_ = 0x3f800000;
        auVar56._20_4_ = 0x3f800000;
        auVar56._24_4_ = 0x3f800000;
        auVar56._28_4_ = 0x3f800000;
        auVar38 = vandps_avx(auVar38,auVar56);
        auVar38 = vsubps_avx(auVar67,auVar38);
        auVar47._8_4_ = 0xbf317218;
        auVar47._0_8_ = 0xbf317218bf317218;
        auVar47._12_4_ = 0xbf317218;
        auVar47._16_4_ = 0xbf317218;
        auVar47._20_4_ = 0xbf317218;
        auVar47._24_4_ = 0xbf317218;
        auVar47._28_4_ = 0xbf317218;
        auVar31 = vfmadd231ps_fma(auVar24,auVar38,auVar47);
        auVar24 = ZEXT1632(auVar31);
        fVar3 = auVar31._0_4_;
        fVar15 = auVar31._4_4_;
        fVar4 = auVar31._8_4_;
        fVar5 = auVar31._12_4_;
        auVar1._28_4_ = 0xbf317218;
        auVar1._0_28_ =
             ZEXT1628(CONCAT412(fVar5 * fVar5,
                                CONCAT48(fVar4 * fVar4,CONCAT44(fVar15 * fVar15,fVar3 * fVar3))));
        auVar51._8_4_ = 0x39506967;
        auVar51._0_8_ = 0x3950696739506967;
        auVar51._12_4_ = 0x39506967;
        auVar51._16_4_ = 0x39506967;
        auVar51._20_4_ = 0x39506967;
        auVar51._24_4_ = 0x39506967;
        auVar51._28_4_ = 0x39506967;
        auVar62._8_4_ = 0x3ab743ce;
        auVar62._0_8_ = 0x3ab743ce3ab743ce;
        auVar62._12_4_ = 0x3ab743ce;
        auVar62._16_4_ = 0x3ab743ce;
        auVar62._20_4_ = 0x3ab743ce;
        auVar62._24_4_ = 0x3ab743ce;
        auVar62._28_4_ = 0x3ab743ce;
        auVar16 = vfmadd213ps_fma(auVar51,auVar24,auVar62);
        auVar63._8_4_ = 0x3c088908;
        auVar63._0_8_ = 0x3c0889083c088908;
        auVar63._12_4_ = 0x3c088908;
        auVar63._16_4_ = 0x3c088908;
        auVar63._20_4_ = 0x3c088908;
        auVar63._24_4_ = 0x3c088908;
        auVar63._28_4_ = 0x3c088908;
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar24,auVar63);
        auVar64._8_4_ = 0x3d2aa9c1;
        auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar64._12_4_ = 0x3d2aa9c1;
        auVar64._16_4_ = 0x3d2aa9c1;
        auVar64._20_4_ = 0x3d2aa9c1;
        auVar64._24_4_ = 0x3d2aa9c1;
        auVar64._28_4_ = 0x3d2aa9c1;
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar24,auVar64);
        auVar65._8_4_ = 0x3e2aaaaa;
        auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar65._12_4_ = 0x3e2aaaaa;
        auVar65._16_4_ = 0x3e2aaaaa;
        auVar65._20_4_ = 0x3e2aaaaa;
        auVar65._24_4_ = 0x3e2aaaaa;
        auVar65._28_4_ = 0x3e2aaaaa;
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar31),auVar65);
        auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar31),auVar53);
        auVar25._0_4_ = fVar3 + 1.0;
        auVar25._4_4_ = fVar15 + 1.0;
        auVar25._8_4_ = fVar4 + 1.0;
        auVar25._12_4_ = fVar5 + 1.0;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar16 = vfmadd231ps_fma(auVar25,auVar1,ZEXT1632(auVar16));
        auVar37._0_4_ = (int)auVar38._0_4_;
        auVar37._4_4_ = (int)auVar38._4_4_;
        auVar37._8_4_ = (int)auVar38._8_4_;
        auVar37._12_4_ = (int)auVar38._12_4_;
        auVar37._16_4_ = (int)auVar38._16_4_;
        auVar37._20_4_ = (int)auVar38._20_4_;
        auVar37._24_4_ = (int)auVar38._24_4_;
        auVar37._28_4_ = (int)auVar38._28_4_;
        auVar38 = vpslld_avx2(auVar37,0x17);
        auVar7._4_4_ = uStack_74;
        auVar7._0_4_ = local_78;
        auVar7._8_4_ = uStack_70;
        auVar7._12_4_ = uStack_6c;
        auVar7._16_4_ = uStack_68;
        auVar7._20_4_ = uStack_64;
        auVar7._24_4_ = uStack_60;
        auVar7._28_4_ = uStack_5c;
        auVar38 = vpaddd_avx2(auVar38,auVar7);
        auVar16 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar16),auVar56);
        auVar38 = vrcpps_avx(ZEXT1632(auVar16));
        auVar6._4_4_ = auVar17._4_4_ * auVar38._4_4_;
        auVar6._0_4_ = auVar17._0_4_ * auVar38._0_4_;
        auVar6._8_4_ = auVar17._8_4_ * auVar38._8_4_;
        auVar6._12_4_ = auVar17._12_4_ * auVar38._12_4_;
        auVar6._16_4_ = auVar17._16_4_ * auVar38._16_4_;
        auVar6._20_4_ = auVar17._20_4_ * auVar38._20_4_;
        auVar6._24_4_ = auVar17._24_4_ * auVar38._24_4_;
        auVar6._28_4_ = 0xbf317218;
        auVar16 = vfmsub213ps_fma(ZEXT1632(auVar16),auVar6,auVar17);
        auVar16 = vfnmadd213ps_fma(ZEXT1632(auVar16),auVar38,auVar6);
        *pauVar10 = ZEXT1632(auVar16);
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar9 + 3 < iVar13; iVar9 = iVar9 + 4) {
        auVar16 = *(undefined1 (*) [16])*pauVar10;
        auVar31._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = -auVar16._8_4_;
        auVar31._12_4_ = -auVar16._12_4_;
        auVar27._8_4_ = 0x42b0c0a5;
        auVar27._0_8_ = 0x42b0c0a542b0c0a5;
        auVar27._12_4_ = 0x42b0c0a5;
        auVar31 = vminps_avx(auVar31,auVar27);
        auVar28._8_4_ = 0xc2b0c0a5;
        auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar28._12_4_ = 0xc2b0c0a5;
        auVar20 = vmaxps_avx(auVar31,auVar28);
        auVar29._8_4_ = 0x3fb8aa3b;
        auVar29._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar29._12_4_ = 0x3fb8aa3b;
        auVar52._8_4_ = 0x3f000000;
        auVar52._0_8_ = 0x3f0000003f000000;
        auVar52._12_4_ = 0x3f000000;
        auVar31 = vfmadd213ps_fma(auVar29,auVar20,auVar52);
        auVar42._0_4_ = (int)auVar31._0_4_;
        auVar42._4_4_ = (int)auVar31._4_4_;
        auVar42._8_4_ = (int)auVar31._8_4_;
        auVar42._12_4_ = (int)auVar31._12_4_;
        auVar27 = vcvtdq2ps_avx(auVar42);
        auVar31 = vcmpps_avx(auVar31,auVar27,1);
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        auVar31 = vandps_avx(auVar31,auVar55);
        auVar31 = vsubps_avx(auVar27,auVar31);
        auVar43._8_4_ = 0xbf317218;
        auVar43._0_8_ = 0xbf317218bf317218;
        auVar43._12_4_ = 0xbf317218;
        auVar20 = vfmadd231ps_fma(auVar20,auVar31,auVar43);
        fVar3 = auVar20._0_4_;
        auVar44._0_4_ = fVar3 * fVar3;
        fVar15 = auVar20._4_4_;
        auVar44._4_4_ = fVar15 * fVar15;
        fVar4 = auVar20._8_4_;
        auVar44._8_4_ = fVar4 * fVar4;
        fVar5 = auVar20._12_4_;
        auVar44._12_4_ = fVar5 * fVar5;
        auVar49._8_4_ = 0x39506967;
        auVar49._0_8_ = 0x3950696739506967;
        auVar49._12_4_ = 0x39506967;
        auVar58._8_4_ = 0x3ab743ce;
        auVar58._0_8_ = 0x3ab743ce3ab743ce;
        auVar58._12_4_ = 0x3ab743ce;
        auVar27 = vfmadd213ps_fma(auVar49,auVar20,auVar58);
        auVar59._8_4_ = 0x3c088908;
        auVar59._0_8_ = 0x3c0889083c088908;
        auVar59._12_4_ = 0x3c088908;
        auVar27 = vfmadd213ps_fma(auVar27,auVar20,auVar59);
        auVar60._8_4_ = 0x3d2aa9c1;
        auVar60._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar60._12_4_ = 0x3d2aa9c1;
        auVar27 = vfmadd213ps_fma(auVar27,auVar20,auVar60);
        auVar61._8_4_ = 0x3e2aaaaa;
        auVar61._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar61._12_4_ = 0x3e2aaaaa;
        auVar27 = vfmadd213ps_fma(auVar27,auVar20,auVar61);
        auVar27 = vfmadd213ps_fma(auVar27,auVar20,auVar52);
        auVar20._0_4_ = fVar3 + 1.0;
        auVar20._4_4_ = fVar15 + 1.0;
        auVar20._8_4_ = fVar4 + 1.0;
        auVar20._12_4_ = fVar5 + 1.0;
        auVar27 = vfmadd231ps_fma(auVar20,auVar44,auVar27);
        auVar30._0_4_ = (int)auVar31._0_4_;
        auVar30._4_4_ = (int)auVar31._4_4_;
        auVar30._8_4_ = (int)auVar31._8_4_;
        auVar30._12_4_ = (int)auVar31._12_4_;
        auVar31 = vpslld_avx(auVar30,0x17);
        auVar45._8_4_ = 0x3f800000;
        auVar45._0_8_ = 0x3f8000003f800000;
        auVar45._12_4_ = 0x3f800000;
        auVar31 = vpaddd_avx(auVar31,auVar45);
        auVar27 = vfmadd213ps_fma(auVar31,auVar27,auVar55);
        auVar31 = vrcpps_avx(auVar27);
        auVar46._0_4_ = auVar16._0_4_ * auVar31._0_4_;
        auVar46._4_4_ = auVar16._4_4_ * auVar31._4_4_;
        auVar46._8_4_ = auVar16._8_4_ * auVar31._8_4_;
        auVar46._12_4_ = auVar16._12_4_ * auVar31._12_4_;
        auVar16 = vfmsub213ps_fma(auVar27,auVar46,auVar16);
        auVar16 = vfnmadd213ps_fma(auVar16,auVar31,auVar46);
        *(undefined1 (*) [16])*pauVar10 = auVar16;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      for (; (int)lVar12 < iVar13; lVar12 = lVar12 + 1) {
        fVar3 = *(float *)((undefined1 *)pvVar8 + lVar12 * 4);
        fVar15 = expf(-fVar3);
        *(float *)((undefined1 *)pvVar8 + lVar12 * 4) = fVar3 / (fVar15 + 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}